

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  long *plVar1;
  simplex_t *psVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 index [16];
  anon_class_24_3_68a6b7c5 pred;
  simplex_t sVar7;
  simplex_t sVar8;
  uint uVar9;
  simplex_t *psVar10;
  simplex_t *psVar11;
  simplex_t *psVar12;
  char k;
  dimension_t k_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  simplex_t *psVar13;
  long lVar14;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *pCVar15;
  char *pcVar16;
  char local_55;
  float local_54;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *local_50;
  char *pcStack_48;
  simplex_t *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  cVar3 = this->k;
  if (-1 < cVar3) {
    pCVar15 = this->simplex_encoding;
    local_38 = (undefined8)this->idx_below;
    uStack_30 = *(undefined8 *)((long)&this->idx_below + 8);
    local_55 = cVar3 + '\x01';
    local_40 = (simplex_t *)&local_38;
    pcVar16 = &local_55;
    pred.k = pcVar16;
    pred.this = pCVar15;
    pred.idx = local_40;
    local_50 = pCVar15;
    pcStack_48 = pcVar16;
    uVar9 = Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>::
            get_max<Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>::get_max_vertex(unsigned__int128,signed_char,int)const::_lambda(int)_1_>
                      (this->j,local_55 + -1,pred);
    this->j = uVar9;
    uVar4 = (ulong)this->idx_above;
    lVar5 = *(long *)((long)&this->idx_above + 8);
    k = this->k + '\x01';
    psVar10 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                         (ulong)uVar9,(int)k,k);
    sVar7 = this->idx_below;
    psVar13 = (simplex_t *)(uVar4 + (long)this->idx_below);
    lVar6 = *(long *)((long)&this->idx_below + 8);
    k_00 = this->dim + -1;
    lVar14 = (long)psVar13 - (long)psVar10;
    index._8_8_ = pcVar16;
    index._0_8_ = pCVar15;
    local_54 = compute_diameter(this->parent,(simplex_t)index,(dimension_t)lVar14);
    psVar11 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                         (ulong)(uint)this->j,(int)(char)(this->k + '\x01'),k_00);
    psVar12 = *(simplex_t **)&this->idx_below;
    *(long *)&this->idx_below = (long)this->idx_below - (long)psVar11;
    plVar1 = (long *)((long)&this->idx_below + 8);
    *plVar1 = (*plVar1 - extraout_RDX_00) - (ulong)(psVar12 < psVar11);
    psVar12 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                         (ulong)(uint)this->j,(int)this->k,k_00);
    psVar2 = &this->idx_above;
    sVar8 = *psVar2;
    *(long *)psVar2 = (long)*psVar2 + (long)psVar12;
    plVar1 = (long *)((long)&this->idx_above + 8);
    *plVar1 = *plVar1 + extraout_RDX_01 + (ulong)CARRY8((ulong)sVar8,(ulong)psVar12);
    this->k = this->k + -1;
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .first = local_54;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                     )._M_payload.
                     super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                     ._M_payload + 0x10) = lVar14;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                      ._M_payload + 0x18) =
         ((lVar5 + lVar6 + (ulong)CARRY8(uVar4,(ulong)sVar7)) - extraout_RDX) -
         (ulong)(psVar13 < psVar10);
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = -1 < cVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }